

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O0

int run_test_fs_readdir_non_empty_dir(void)

{
  void *dir_00;
  int iVar1;
  uv_os_fd_t file_00;
  uv_loop_t *puVar2;
  int64_t eval_b_22;
  int64_t eval_a_22;
  int64_t eval_b_21;
  int64_t eval_a_21;
  int64_t eval_b_20;
  int64_t eval_a_20;
  int64_t eval_b_19;
  int64_t eval_a_19;
  int64_t eval_b_18;
  int64_t eval_a_18;
  int64_t eval_b_17;
  int64_t eval_a_17;
  int64_t eval_b_16;
  int64_t eval_a_16;
  int64_t eval_b_15;
  int64_t eval_a_15;
  int64_t eval_b_14;
  int64_t eval_a_14;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  void *eval_b_11;
  void *eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  uv_os_fd_t file;
  uv_dir_t *dir;
  uv_fs_t close_req;
  uv_fs_t create_req;
  uv_fs_t rmdir_req;
  uv_fs_t mkdir_req;
  size_t entries_count;
  
  cleanup_test_files();
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_mkdir(puVar2,(uv_fs_t *)&rmdir_req.bufsml[3].len,"test_dir",0x1ed,(uv_fs_cb)0x0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x165,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_open(puVar2,(uv_fs_t *)&close_req.bufsml[3].len,"test_dir/file1",0x41,0x180,
                     (uv_fs_cb)0x0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x16d,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)create_req.cb < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x16e,"create_req.result",">=","0",create_req.cb,">=",0);
    abort();
  }
  file_00 = (uv_os_fd_t)create_req.cb;
  uv_fs_req_cleanup((uv_fs_t *)&close_req.bufsml[3].len);
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_close(puVar2,(uv_fs_t *)&dir,file_00,(uv_fs_cb)0x0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x172,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&dir);
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_open(puVar2,(uv_fs_t *)&close_req.bufsml[3].len,"test_dir/file2",0x41,0x180,
                     (uv_fs_cb)0x0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x17a,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)create_req.cb < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x17b,"create_req.result",">=","0",create_req.cb,">=",0);
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&close_req.bufsml[3].len);
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_close(puVar2,(uv_fs_t *)&dir,(uv_os_fd_t)create_req.cb,(uv_fs_cb)0x0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x17f,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&dir);
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_mkdir(puVar2,(uv_fs_t *)&rmdir_req.bufsml[3].len,"test_dir/test_subdir",0x1ed,
                      (uv_fs_cb)0x0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x187,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&rmdir_req.bufsml[3].len);
  memset(&opendir_req,0xdb,0x1c0);
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test_dir",(uv_fs_cb)0x0);
  dir_00 = opendir_req.ptr;
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,399,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)opendir_req.fs_type != 0x1f) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,400,"opendir_req.fs_type","==","UV_FS_OPENDIR",(long)opendir_req.fs_type,"==",0x1f);
    abort();
  }
  if (opendir_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x191,"opendir_req.result","==","0",opendir_req.result,"==",0);
    abort();
  }
  if (opendir_req.ptr == (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x192,"opendir_req.ptr","!=","NULL",0,"!=",0);
    abort();
  }
  mkdir_req.bufsml[3].len = 0;
  *(uv_dirent_t **)opendir_req.ptr = dirents;
  *(undefined8 *)((long)dir_00 + 8) = 1;
  uv_fs_req_cleanup(&opendir_req);
  while( true ) {
    puVar2 = uv_default_loop();
    iVar1 = uv_fs_readdir(puVar2,&readdir_req,(uv_dir_t *)dir_00,(uv_fs_cb)0x0);
    if (iVar1 == 0) break;
    iVar1 = strcmp(dirents[0].name,"file1");
    if (((iVar1 != 0) && (iVar1 = strcmp(dirents[0].name,"file2"), iVar1 != 0)) &&
       (iVar1 = strcmp(dirents[0].name,"test_subdir"), iVar1 != 0)) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
              ,0x1a0,
              "strcmp(dirents[0].name, \"file1\") == 0 || strcmp(dirents[0].name, \"file2\") == 0 || strcmp(dirents[0].name, \"test_subdir\") == 0"
             );
      abort();
    }
    iVar1 = strcmp(dirents[0].name,"test_subdir");
    if (iVar1 == 0) {
      if ((ulong)dirents[0].type != 2) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
                ,0x1a3,"dirents[0].type","==","UV_DIRENT_DIR",(ulong)dirents[0].type,"==",2);
        abort();
      }
    }
    else if ((ulong)dirents[0].type != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
              ,0x1a5,"dirents[0].type","==","UV_DIRENT_FILE",(ulong)dirents[0].type,"==",1);
      abort();
    }
    uv_fs_req_cleanup(&readdir_req);
    mkdir_req.bufsml[3].len = mkdir_req.bufsml[3].len + 1;
  }
  if (mkdir_req.bufsml[3].len != 3) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x1ad,"3","==","entries_count",3,"==",mkdir_req.bufsml[3].len);
    abort();
  }
  uv_fs_req_cleanup(&readdir_req);
  memset(&closedir_req,0xdb,0x1c0);
  puVar2 = uv_default_loop();
  uv_fs_closedir(puVar2,&closedir_req,(uv_dir_t *)dir_00,(uv_fs_cb)0x0);
  if (closedir_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x1b3,"closedir_req.result","==","0",closedir_req.result,"==",0);
    abort();
  }
  uv_fs_req_cleanup(&closedir_req);
  memset(&opendir_req,0xdb,0x1c0);
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test_dir",non_empty_opendir_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x1bf,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)non_empty_opendir_cb_count != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x1c0,"non_empty_opendir_cb_count","==","0",(long)non_empty_opendir_cb_count,"==",0);
    abort();
  }
  if ((long)non_empty_closedir_cb_count != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x1c1,"non_empty_closedir_cb_count","==","0",(long)non_empty_closedir_cb_count,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)iVar1 == 0) {
    if ((long)non_empty_opendir_cb_count != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
              ,0x1c4,"1","==","non_empty_opendir_cb_count",1,"==",(long)non_empty_opendir_cb_count);
      abort();
    }
    if ((long)non_empty_closedir_cb_count == 1) {
      puVar2 = uv_default_loop();
      uv_fs_rmdir(puVar2,(uv_fs_t *)&create_req.bufsml[3].len,"test_subdir",(uv_fs_cb)0x0);
      uv_fs_req_cleanup((uv_fs_t *)&create_req.bufsml[3].len);
      cleanup_test_files();
      puVar2 = uv_default_loop();
      close_loop(puVar2);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if ((long)iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
              ,0x1cb,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
      abort();
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x1c5,"1","==","non_empty_closedir_cb_count",1,"==",(long)non_empty_closedir_cb_count);
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
          ,0x1c3,"r","==","0",(long)iVar1,"==",0);
  abort();
}

Assistant:

TEST_IMPL(fs_readdir_non_empty_dir) {
  size_t entries_count;
  uv_fs_t mkdir_req;
  uv_fs_t rmdir_req;
  uv_fs_t create_req;
  uv_fs_t close_req;
  uv_dir_t* dir;
  uv_os_fd_t file;
  int r;

  cleanup_test_files();

  r = uv_fs_mkdir(uv_default_loop(), &mkdir_req, "test_dir", 0755, NULL);
  ASSERT_OK(r);

  /* Create two files synchronously. */
  r = uv_fs_open(uv_default_loop(),
                 &create_req,
                 "test_dir/file1",
                 UV_FS_O_WRONLY | UV_FS_O_CREAT, S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT_OK(r);
  ASSERT_GE(create_req.result, 0);
  file = (uv_os_fd_t) create_req.result;
  uv_fs_req_cleanup(&create_req);
  r = uv_fs_close(uv_default_loop(), &close_req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(uv_default_loop(),
                 &create_req,
                 "test_dir/file2",
                 UV_FS_O_WRONLY | UV_FS_O_CREAT, S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT_OK(r);
  ASSERT_GE(create_req.result, 0);
  file = (uv_os_fd_t) create_req.result;
  uv_fs_req_cleanup(&create_req);
  r = uv_fs_close(uv_default_loop(), &close_req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_mkdir(uv_default_loop(),
                  &mkdir_req,
                  "test_dir/test_subdir",
                  0755,
                  NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&mkdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the synchronous flavor. */
  r = uv_fs_opendir(uv_default_loop(), &opendir_req, "test_dir", NULL);
  ASSERT_OK(r);
  ASSERT_EQ(opendir_req.fs_type, UV_FS_OPENDIR);
  ASSERT_OK(opendir_req.result);
  ASSERT_NOT_NULL(opendir_req.ptr);

  entries_count = 0;
  dir = opendir_req.ptr;
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);
  uv_fs_req_cleanup(&opendir_req);

  while (uv_fs_readdir(uv_default_loop(),
                       &readdir_req,
                       dir,
                       NULL) != 0) {
  ASSERT(strcmp(dirents[0].name, "file1") == 0 ||
         strcmp(dirents[0].name, "file2") == 0 ||
         strcmp(dirents[0].name, "test_subdir") == 0);
#ifdef HAVE_DIRENT_TYPES
    if (!strcmp(dirents[0].name, "test_subdir"))
      ASSERT_EQ(dirents[0].type, UV_DIRENT_DIR);
    else
      ASSERT_EQ(dirents[0].type, UV_DIRENT_FILE);
#else
    ASSERT_EQ(dirents[0].type, UV_DIRENT_UNKNOWN);
#endif /* HAVE_DIRENT_TYPES */
    uv_fs_req_cleanup(&readdir_req);
    ++entries_count;
  }

  ASSERT_EQ(3, entries_count);
  uv_fs_req_cleanup(&readdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&closedir_req, 0xdb, sizeof(closedir_req));
  uv_fs_closedir(uv_default_loop(), &closedir_req, dir, NULL);
  ASSERT_OK(closedir_req.result);
  uv_fs_req_cleanup(&closedir_req);

  /* Testing the asynchronous flavor. */

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  r = uv_fs_opendir(uv_default_loop(),
                    &opendir_req,
                    "test_dir",
                    non_empty_opendir_cb);
  ASSERT_OK(r);
  ASSERT_OK(non_empty_opendir_cb_count);
  ASSERT_OK(non_empty_closedir_cb_count);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);
  ASSERT_EQ(1, non_empty_opendir_cb_count);
  ASSERT_EQ(1, non_empty_closedir_cb_count);

  uv_fs_rmdir(uv_default_loop(), &rmdir_req, "test_subdir", NULL);
  uv_fs_req_cleanup(&rmdir_req);

  cleanup_test_files();
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
 }